

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float128_round_to_int_mips(float128 a,float_status *status)

{
  float128 fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float128 fVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ushort uVar15;
  float128 fVar16;
  
  uVar11 = a.high;
  uVar14 = a.low;
  uVar15 = a.high._6_2_ & 0x7fff;
  if (0x402e < uVar15) {
    if (0x406e < uVar15) {
      if (uVar15 != 0x7fff) {
        return a;
      }
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          uVar14 == 0) {
        return a;
      }
      fVar16 = propagateFloat128NaN(a,a,status);
      return fVar16;
    }
    uVar13 = 2L << (0x6eU - (char)uVar15 & 0x3f);
    if (5 < (byte)status->float_rounding_mode) {
LAB_007233ef:
      abort();
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar13 - 1;
    fVar16 = a;
    switch(status->float_rounding_mode) {
    case '\0':
      if (uVar15 == 0x402f) {
        if ((long)uVar14 < 0) {
          uVar10 = 0x8000000000000000;
          uVar12 = uVar11 + 1 & 0xfffffffffffffffe;
          if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)
          {
            uVar10 = uVar14;
            uVar12 = uVar11 + 1;
          }
          fVar16.high = uVar12;
          fVar16.low = uVar10;
        }
      }
      else {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar13 >> 1;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar13 >> 1;
        uVar11 = SUB168((undefined1  [16])a + auVar8,0);
        fVar16 = (float128)((undefined1  [16])a + auVar7);
        if ((uVar11 & uVar13 - 1) == 0) {
          fVar16.high = SUB168((undefined1  [16])a + auVar8,8);
          fVar16.low = uVar11 & ~uVar13;
        }
      }
      break;
    case '\x01':
      if ((long)uVar11 < 0) {
LAB_00723328:
        fVar16 = (float128)((undefined1  [16])a + auVar2);
      }
      break;
    case '\x02':
      if (-1 < (long)uVar11) goto LAB_00723328;
      break;
    case '\x04':
      if (uVar15 == 0x402f) {
        fVar16.high = uVar11 - ((long)uVar14 >> 0x3f);
        fVar16.low = uVar14;
      }
      else {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar13 >> 1;
        fVar16 = (float128)((undefined1  [16])a + auVar4);
      }
      break;
    case '\x05':
      uVar11 = (ulong)((uint)a.high & 1);
      if (uVar15 != 0x402f) {
        uVar11 = uVar13 & uVar14;
      }
      if (uVar11 == 0) goto LAB_00723328;
    }
    uVar11 = fVar16.high;
    uVar14 = -uVar13 & fVar16.low;
LAB_007233d5:
    fVar9.high = uVar11;
    fVar9.low = uVar14;
    if (a == fVar9) {
      return a;
    }
    status->float_exception_flags = status->float_exception_flags | 0x20;
    fVar1.high = uVar11;
    fVar1.low = uVar14;
    return fVar1;
  }
  if (0x3ffe < uVar15) {
    uVar13 = 1L << (0x2fU - (char)uVar15 & 0x3f);
    if (5 < (byte)status->float_rounding_mode) goto LAB_007233ef;
    switch(status->float_rounding_mode) {
    case '\0':
      uVar11 = (uVar13 >> 1) + uVar11;
      if ((uVar13 - 1 & uVar11) == 0 && uVar14 == 0) {
        uVar11 = uVar11 & ~uVar13;
      }
      break;
    case '\x01':
      if ((long)uVar11 < 0) {
LAB_007232e2:
        uVar11 = (uVar13 - 1) + (uVar14 != 0 | uVar11);
      }
      break;
    case '\x02':
      if (-1 < (long)uVar11) goto LAB_007232e2;
      break;
    case '\x04':
      uVar11 = (uVar13 >> 1) + uVar11;
      break;
    case '\x05':
      if ((uVar13 & uVar11) == 0) goto LAB_007232e2;
    }
    uVar11 = -uVar13 & uVar11;
    uVar14 = 0;
    goto LAB_007233d5;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 &&
      uVar14 == 0) {
    return a;
  }
  status->float_exception_flags = status->float_exception_flags | 0x20;
  uVar13 = uVar11 & 0x8000000000000000;
  switch(status->float_rounding_mode) {
  case '\0':
    if (uVar15 != 0x3ffe) goto switchD_00723184_caseD_3;
    uVar12 = uVar13 | 0x3fff000000000000;
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        uVar14 == 0) {
      uVar12 = uVar13;
    }
    break;
  case '\x01':
    uVar11 = (long)uVar11 >> 0x3f & 0xbfff000000000000;
    goto LAB_00723387;
  case '\x02':
    uVar12 = 0x8000000000000000;
    if (-1 < (long)uVar11) {
      uVar12 = 0x3fff000000000000;
    }
    break;
  case '\x04':
    uVar11 = uVar13 | 0x3fff000000000000;
    if (uVar15 != 0x3ffe) {
      uVar11 = uVar13;
    }
LAB_00723387:
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar11;
    return (float128)(auVar5 << 0x40);
  case '\x05':
    uVar13 = uVar13 | 0x3fff000000000000;
  default:
switchD_00723184_caseD_3:
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar13;
    return (float128)(auVar6 << 0x40);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar12;
  return (float128)(auVar3 << 0x40);
}

Assistant:

float128 float128_round_to_int(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t lastBitMask, roundBitsMask;
    float128 z;

    aExp = extractFloat128Exp( a );
    if ( 0x402F <= aExp ) {
        if ( 0x406F <= aExp ) {
            if (    ( aExp == 0x7FFF )
                 && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) )
               ) {
                return propagateFloat128NaN(a, a, status);
            }
            return a;
        }
        lastBitMask = 1;
        lastBitMask = ( lastBitMask<<( 0x406E - aExp ) )<<1;
        roundBitsMask = lastBitMask - 1;
        z = a;
        switch (status->float_rounding_mode) {
        case float_round_nearest_even:
            if ( lastBitMask ) {
                add128( z.high, z.low, 0, lastBitMask>>1, &z.high, &z.low );
                if ( ( z.low & roundBitsMask ) == 0 ) z.low &= ~ lastBitMask;
            }
            else {
                if ( (int64_t) z.low < 0 ) {
                    ++z.high;
                    if ( (uint64_t) ( z.low<<1 ) == 0 ) z.high &= ~1;
                }
            }
            break;
        case float_round_ties_away:
            if (lastBitMask) {
                add128(z.high, z.low, 0, lastBitMask >> 1, &z.high, &z.low);
            } else {
                if ((int64_t) z.low < 0) {
                    ++z.high;
                }
            }
            break;
        case float_round_to_zero:
            break;
        case float_round_up:
            if (!extractFloat128Sign(z)) {
                add128(z.high, z.low, 0, roundBitsMask, &z.high, &z.low);
            }
            break;
        case float_round_down:
            if (extractFloat128Sign(z)) {
                add128(z.high, z.low, 0, roundBitsMask, &z.high, &z.low);
            }
            break;
        case float_round_to_odd:
            /*
             * Note that if lastBitMask == 0, the last bit is the lsb
             * of high, and roundBitsMask == -1.
             */
            if ((lastBitMask ? z.low & lastBitMask : z.high & 1) == 0) {
                add128(z.high, z.low, 0, roundBitsMask, &z.high, &z.low);
            }
            break;
        default:
            abort();
        }
        z.low &= ~ roundBitsMask;
    }
    else {
        if ( aExp < 0x3FFF ) {
            if ( ( ( (uint64_t) ( a.high<<1 ) ) | a.low ) == 0 ) return a;
            status->float_exception_flags |= float_flag_inexact;
            aSign = extractFloat128Sign( a );
            switch (status->float_rounding_mode) {
            case float_round_nearest_even:
                if (    ( aExp == 0x3FFE )
                     && (   extractFloat128Frac0( a )
                          | extractFloat128Frac1( a ) )
                   ) {
                    return packFloat128( aSign, 0x3FFF, 0, 0 );
                }
                break;
            case float_round_ties_away:
                if (aExp == 0x3FFE) {
                    return packFloat128(aSign, 0x3FFF, 0, 0);
                }
                break;
            case float_round_down:
                return
                      aSign ? packFloat128( 1, 0x3FFF, 0, 0 )
                    : packFloat128( 0, 0, 0, 0 );
            case float_round_up:
                return
                      aSign ? packFloat128( 1, 0, 0, 0 )
                    : packFloat128( 0, 0x3FFF, 0, 0 );

            case float_round_to_odd:
                return packFloat128(aSign, 0x3FFF, 0, 0);
            }
            return packFloat128( aSign, 0, 0, 0 );
        }
        lastBitMask = 1;
        lastBitMask <<= 0x402F - aExp;
        roundBitsMask = lastBitMask - 1;
        z.low = 0;
        z.high = a.high;
        switch (status->float_rounding_mode) {
        case float_round_nearest_even:
            z.high += lastBitMask>>1;
            if ( ( ( z.high & roundBitsMask ) | a.low ) == 0 ) {
                z.high &= ~ lastBitMask;
            }
            break;
        case float_round_ties_away:
            z.high += lastBitMask>>1;
            break;
        case float_round_to_zero:
            break;
        case float_round_up:
            if (!extractFloat128Sign(z)) {
                z.high |= ( a.low != 0 );
                z.high += roundBitsMask;
            }
            break;
        case float_round_down:
            if (extractFloat128Sign(z)) {
                z.high |= (a.low != 0);
                z.high += roundBitsMask;
            }
            break;
        case float_round_to_odd:
            if ((z.high & lastBitMask) == 0) {
                z.high |= (a.low != 0);
                z.high += roundBitsMask;
            }
            break;
        default:
            abort();
        }
        z.high &= ~ roundBitsMask;
    }
    if ( ( z.low != a.low ) || ( z.high != a.high ) ) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}